

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  _func_int **__s;
  Expr *pEVar1;
  Result RVar2;
  size_t sVar3;
  Enum EVar4;
  Expr *expr;
  LabelNode *label;
  Expr *local_38;
  LabelNode *local_30;
  
  RVar2 = TopLabelExpr(this,&local_30,&local_38);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    if (local_30->label_type == If) {
      if (local_38->type_ != If) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]");
      }
      __s = (_func_int **)this->filename_;
      pEVar1 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      sVar3 = strlen((char *)__s);
      *(size_t *)&local_38[3].type_ = sVar3;
      local_38[4]._vptr_Expr = __s;
      local_38[4].super_intrusive_list_base<wabt::Expr>.next_ = pEVar1;
      *(undefined4 *)&local_38[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      local_30->exprs = (ExprList *)&local_38[4].loc;
      local_30->label_type = Else;
      EVar4 = Ok;
    }
    else {
      PrintError(this,"else expression without matching if");
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}